

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

tuple pybind11::
      make_tuple<(pybind11::return_value_policy)1,pybind11::cpp_function,pybind11::none,pybind11::none,char_const(&)[1]>
                (cpp_function *args_,none *args__1,none *args__2,char (*args__3) [1])

{
  ulong uVar1;
  bool bVar2;
  handle parent;
  size_type sVar3;
  handle *this;
  undefined8 uVar4;
  PyObject **ppPVar5;
  char *in_RDX;
  object in_RDI;
  value_type *arg_value;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_4UL> *__range2;
  int counter;
  size_t i;
  array<pybind11::object,_4UL> args;
  size_t size;
  tuple *result;
  PyTypeObject *in_stack_fffffffffffffe78;
  array<pybind11::object,_4UL> *in_stack_fffffffffffffe80;
  handle in_stack_fffffffffffffe88;
  array<pybind11::object,_4UL> *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  tuple *in_stack_fffffffffffffea0;
  object *poVar6;
  return_value_policy policy;
  handle local_e0;
  iterator local_d8;
  iterator local_d0;
  iterator local_c8;
  array<pybind11::object,_4UL> *local_c0;
  int local_b8;
  undefined1 local_b1;
  ulong local_b0;
  handle local_a8;
  PyObject *local_a0;
  handle local_98;
  PyObject *local_90;
  handle local_88;
  PyObject *local_80;
  handle local_68;
  PyObject *local_60;
  object *local_58;
  array<pybind11::object,_4UL> local_50;
  undefined8 local_30;
  char *local_18;
  
  local_30 = 4;
  local_58 = local_50._M_elems;
  local_18 = in_RDX;
  handle::handle(&local_68,(PyObject *)0x0);
  parent = detail::pyobject_caster<pybind11::cpp_function>::cast
                     ((handle *)in_stack_fffffffffffffe80,
                      (return_value_policy)((ulong)in_stack_fffffffffffffe78 >> 0x38),
                      in_stack_fffffffffffffe88);
  local_60 = parent.m_ptr;
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffe88);
  poVar6 = local_50._M_elems + 1;
  local_58 = poVar6;
  handle::handle(&local_88,(PyObject *)0x0);
  policy = (return_value_policy)((ulong)poVar6 >> 0x38);
  local_80 = (PyObject *)
             detail::pyobject_caster<pybind11::none>::cast
                       ((handle *)in_stack_fffffffffffffe80,
                        (return_value_policy)((ulong)in_stack_fffffffffffffe78 >> 0x38),
                        in_stack_fffffffffffffe88);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffe88);
  local_58 = local_50._M_elems + 2;
  handle::handle(&local_98,(PyObject *)0x0);
  local_90 = (PyObject *)
             detail::pyobject_caster<pybind11::none>::cast
                       ((handle *)in_stack_fffffffffffffe80,
                        (return_value_policy)((ulong)in_stack_fffffffffffffe78 >> 0x38),
                        in_stack_fffffffffffffe88);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffe88);
  local_58 = local_50._M_elems + 3;
  handle::handle(&local_a8,(PyObject *)0x0);
  local_a0 = (PyObject *)detail::type_caster<char,_void>::cast(local_18,policy,parent);
  reinterpret_steal<pybind11::object>(in_stack_fffffffffffffe88);
  local_b0 = 0;
  while( true ) {
    uVar1 = local_b0;
    sVar3 = std::array<pybind11::object,_4UL>::size(&local_50);
    if (sVar3 <= uVar1) {
      local_b1 = 0;
      tuple::tuple(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      local_b8 = 0;
      local_c0 = &local_50;
      local_c8 = std::array<pybind11::object,_4UL>::begin((array<pybind11::object,_4UL> *)0x3a1438);
      local_d0 = std::array<pybind11::object,_4UL>::end((array<pybind11::object,_4UL> *)0x3a144d);
      for (; local_c8 != local_d0; local_c8 = local_c8 + 1) {
        local_d8 = local_c8;
        local_e0 = object::release((object *)in_stack_fffffffffffffe78);
        ppPVar5 = handle::ptr(&local_e0);
        in_stack_fffffffffffffe78 = (PyTypeObject *)*ppPVar5;
        ppPVar5 = handle::ptr((handle *)in_RDI.super_handle.m_ptr);
        (&(*ppPVar5)[1].ob_type)[local_b8] = in_stack_fffffffffffffe78;
        local_b8 = local_b8 + 1;
      }
      local_b1 = 1;
      std::array<pybind11::object,_4UL>::~array(in_stack_fffffffffffffe90);
      return (tuple)in_RDI.super_handle.m_ptr;
    }
    this = &std::array<pybind11::object,_4UL>::operator[]
                      (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78)->super_handle
    ;
    bVar2 = handle::operator_cast_to_bool(this);
    if (!bVar2) break;
    local_b0 = local_b0 + 1;
  }
  uVar4 = __cxa_allocate_exception(0x10);
  cast_error::runtime_error
            ((cast_error *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
  __cxa_throw(uVar4,&cast_error::typeinfo,cast_error::~cast_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}